

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_loc.c
# Opt level: O1

int cook_loclists_contents(Dwarf_Debug dbg,Dwarf_Loc_Head_c llhead,Dwarf_Error *error)

{
  Dwarf_CU_Context_conflict context;
  Dwarf_Locdesc_c pDVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  Dwarf_Unsigned DVar7;
  long lVar8;
  bool bVar9;
  Dwarf_Addr targaddr;
  char *local_58;
  dwarfstring_s local_50;
  
  DVar7 = llhead->ll_locdesc_count;
  if (DVar7 != 0) {
    context = llhead->ll_context;
    bVar9 = llhead->ll_cu_base_address_present == 0;
    local_58 = (char *)llhead->ll_cu_base_address;
    lVar8 = 0x30;
    bVar3 = false;
    do {
      pDVar1 = llhead->ll_locdesc;
      bVar4 = true;
      switch(*(undefined1 *)((long)pDVar1 + lVar8 + -0x2e)) {
      case 0:
      case 5:
        break;
      case 1:
        local_50.s_data = (char *)0x0;
        iVar5 = -1;
        if (!bVar3) {
          iVar5 = _dwarf_look_in_local_and_tied_by_index
                            (dbg,context,*(Dwarf_Unsigned *)((long)pDVar1 + lVar8 + -0x18),
                             (Dwarf_Addr *)&local_50,error);
        }
        if (iVar5 == 0) {
          local_58 = local_50.s_data;
          *(char **)((long)pDVar1 + lVar8 + -0x10) = local_50.s_data;
          goto LAB_00173a56;
        }
        *(undefined4 *)((long)pDVar1 + lVar8 + -0x2c) = 1;
        *(undefined8 *)((long)pDVar1 + lVar8 + -0x10) = 0;
        bVar9 = true;
        if ((error != (Dwarf_Error *)0x0) && (iVar5 == 1)) {
          dwarf_dealloc_error(dbg,*error);
          *error = (Dwarf_Error)0x0;
        }
        bVar3 = true;
        break;
      case 2:
        local_50.s_data = (char *)0x0;
        iVar5 = -1;
        if (!bVar3) {
          iVar5 = _dwarf_look_in_local_and_tied_by_index
                            (dbg,context,*(Dwarf_Unsigned *)((long)pDVar1 + lVar8 + -0x18),
                             (Dwarf_Addr *)&local_50,error);
        }
        if (iVar5 == 0) {
          *(char **)((long)pDVar1 + lVar8 + -0x10) = local_50.s_data;
        }
        else {
          *(undefined4 *)((long)pDVar1 + lVar8 + -0x2c) = 1;
          *(undefined8 *)((long)pDVar1 + lVar8 + -0x10) = 0;
          bVar3 = true;
          if ((error != (Dwarf_Error *)0x0) && (iVar5 == 1)) {
            dwarf_dealloc_error(dbg,*error);
            bVar3 = true;
            *error = (Dwarf_Error)0x0;
          }
        }
        iVar5 = -1;
        if (!bVar3) {
          iVar5 = _dwarf_look_in_local_and_tied_by_index
                            (dbg,context,*(Dwarf_Unsigned *)((long)pDVar1 + lVar8 + -8),
                             (Dwarf_Addr *)&local_50,error);
        }
        pcVar6 = local_50.s_data;
        if (iVar5 == 0) goto LAB_00173a32;
        *(undefined4 *)((long)pDVar1 + lVar8 + -0x2c) = 1;
        *(undefined8 *)((long)&pDVar1->ld_lkind + lVar8) = 0;
LAB_001739f6:
        bVar3 = true;
        if ((error != (Dwarf_Error *)0x0) && (iVar5 == 1)) {
          dwarf_dealloc_error(dbg,*error);
          bVar3 = true;
          *error = (Dwarf_Error)0x0;
        }
        break;
      case 3:
        local_50.s_data = (char *)0x0;
        iVar5 = -1;
        if (!bVar3) {
          iVar5 = _dwarf_look_in_local_and_tied_by_index
                            (dbg,context,*(Dwarf_Unsigned *)((long)pDVar1 + lVar8 + -0x18),
                             (Dwarf_Addr *)&local_50,error);
        }
        if (iVar5 != 0) {
          *(undefined4 *)((long)pDVar1 + lVar8 + -0x2c) = 1;
          *(undefined8 *)((long)pDVar1 + lVar8 + -0x10) = 0;
          goto LAB_001739f6;
        }
        *(char **)((long)pDVar1 + lVar8 + -0x10) = local_50.s_data;
        pcVar6 = local_50.s_data + *(long *)((long)pDVar1 + lVar8 + -8);
        goto LAB_00173a32;
      case 4:
        if (!bVar9) {
          *(char **)((long)pDVar1 + lVar8 + -0x10) =
               local_58 + *(long *)((long)pDVar1 + lVar8 + -0x18);
          pcVar6 = local_58 + *(long *)((long)pDVar1 + lVar8 + -8);
          goto LAB_00173a52;
        }
        *(undefined4 *)((long)pDVar1 + lVar8 + -0x2c) = 1;
        *(undefined8 *)((long)pDVar1 + lVar8 + -0x10) = 0;
        *(undefined8 *)((long)&pDVar1->ld_lkind + lVar8) = 0;
        bVar9 = true;
        break;
      case 6:
        pcVar6 = *(char **)((long)pDVar1 + lVar8 + -0x18);
        *(char **)((long)pDVar1 + lVar8 + -0x10) = pcVar6;
        local_58 = pcVar6;
LAB_00173a52:
        *(char **)((long)&pDVar1->ld_lkind + lVar8) = pcVar6;
LAB_00173a56:
        bVar9 = false;
        break;
      case 7:
        *(undefined8 *)((long)pDVar1 + lVar8 + -0x10) =
             *(undefined8 *)((long)pDVar1 + lVar8 + -0x18);
        *(undefined8 *)((long)&pDVar1->ld_lkind + lVar8) =
             *(undefined8 *)((long)pDVar1 + lVar8 + -8);
        break;
      case 8:
        lVar2 = *(long *)((long)pDVar1 + lVar8 + -0x18);
        *(long *)((long)pDVar1 + lVar8 + -0x10) = lVar2;
        pcVar6 = (char *)(lVar2 + *(long *)((long)pDVar1 + lVar8 + -8));
LAB_00173a32:
        *(char **)((long)&pDVar1->ld_lkind + lVar8) = pcVar6;
        break;
      default:
        dwarfstring_constructor(&local_50);
        dwarfstring_append_printf_u
                  (&local_50,
                   "DW_DLE_LOCLISTS_ERROR: improper DW_LLE code of 0x%x is unknown. DWARF5 loclists error"
                   ,(ulong)*(byte *)((long)pDVar1 + lVar8 + -0x2e));
        pcVar6 = dwarfstring_string(&local_50);
        _dwarf_error_string(dbg,error,0x1d5,pcVar6);
        dwarfstring_destructor(&local_50);
        bVar4 = false;
      }
      if (!bVar4) {
        return 1;
      }
      lVar8 = lVar8 + 0x98;
      DVar7 = DVar7 - 1;
    } while (DVar7 != 0);
  }
  return 0;
}

Assistant:

static int
cook_loclists_contents(Dwarf_Debug dbg,
    Dwarf_Loc_Head_c llhead,
    Dwarf_Error *error)
{
    Dwarf_Unsigned baseaddress = llhead->ll_cu_base_address;
    Dwarf_Unsigned count = llhead->ll_locdesc_count;
    Dwarf_Unsigned i = 0;
    Dwarf_CU_Context cucontext = llhead->ll_context;
    int res = 0;
    Dwarf_Bool base_address_fail = FALSE;
    Dwarf_Bool debug_addr_fail = FALSE;

    if (!llhead->ll_cu_base_address_present) {
        base_address_fail = TRUE;
    }
    for (i = 0 ; i < count ; ++i) {
        Dwarf_Locdesc_c  llc = 0;

        llc = llhead->ll_locdesc +i;
        switch(llc->ld_lle_value) {
        case DW_LLE_base_addressx: {
            Dwarf_Addr targaddr = 0;
            if (debug_addr_fail) {
                res = DW_DLV_NO_ENTRY;
            } else {
                res = _dwarf_look_in_local_and_tied_by_index(
                    dbg,cucontext,llc->ld_rawlow,&targaddr,
                    error);
            }
            if (res != DW_DLV_OK) {
                debug_addr_fail = TRUE;
                base_address_fail = TRUE;
                llc->ld_index_failed = TRUE;
                llc->ld_lopc = 0;
                if (res == DW_DLV_ERROR && error) {
                    dwarf_dealloc_error(dbg, *error);
                    *error = 0;
                }
            } else {
                base_address_fail = FALSE;
                baseaddress = targaddr;
                llc->ld_lopc = targaddr;
            }
            break;
        }
        case DW_LLE_startx_endx:{
            /* two indexes into debug_addr */
            Dwarf_Addr targaddr = 0;
            if (debug_addr_fail) {
                res = DW_DLV_NO_ENTRY;
            } else {
                res = _dwarf_look_in_local_and_tied_by_index(
                    dbg,cucontext,llc->ld_rawlow,&targaddr,
                    error);
            }
            if (res != DW_DLV_OK) {
                debug_addr_fail = TRUE;
                llc->ld_index_failed = TRUE;
                llc->ld_lopc = 0;
                if (res == DW_DLV_ERROR && error) {
                    dwarf_dealloc_error(dbg, *error);
                    *error = 0;
                }
            } else {
                llc->ld_lopc = targaddr;
            }
            if (debug_addr_fail) {
                res = DW_DLV_NO_ENTRY;
            } else {
                res = _dwarf_look_in_local_and_tied_by_index(
                    dbg,cucontext,llc->ld_rawhigh,&targaddr,
                    error);

            }
            if (res != DW_DLV_OK) {
                debug_addr_fail = TRUE;
                llc->ld_index_failed = TRUE;
                llc->ld_highpc = 0;
                if (res == DW_DLV_ERROR && error) {
                    dwarf_dealloc_error(dbg, *error);
                    *error = 0;
                }
            } else {
                llc->ld_highpc = targaddr;
            }
            break;
        }
        case DW_LLE_startx_length:{
            /* one index to debug_addr other a length */
            Dwarf_Addr targaddr = 0;
            if (debug_addr_fail) {
                res = DW_DLV_NO_ENTRY;
            } else  {
                res = _dwarf_look_in_local_and_tied_by_index(
                    dbg,cucontext,llc->ld_rawlow,&targaddr,
                    error);
            }
            if (res != DW_DLV_OK) {
                debug_addr_fail = TRUE;
                llc->ld_index_failed = TRUE;
                llc->ld_lopc = 0;
                if (res == DW_DLV_ERROR && error) {
                    dwarf_dealloc_error(dbg, *error);
                    *error = 0;
                }
            } else {
                llc->ld_lopc = targaddr;
                llc->ld_highpc = targaddr + llc->ld_rawhigh;
            }
            break;
        }
        case DW_LLE_offset_pair:{
            if (base_address_fail) {
                llc->ld_index_failed = TRUE;
                llc->ld_lopc = 0;
                llc->ld_highpc = 0;
            } else {
                /*offsets of the current base address*/
                llc->ld_lopc = llc->ld_rawlow +baseaddress;
                llc->ld_highpc = llc->ld_rawhigh +baseaddress;
            }
            break;
        }
        case DW_LLE_default_location:{
            /*  nothing to do here, just has a counted
                location description */
            break;
        }
        case DW_LLE_base_address:{
            llc->ld_lopc = llc->ld_rawlow;
            llc->ld_highpc = llc->ld_rawlow;
            baseaddress = llc->ld_rawlow;
            base_address_fail = FALSE;
            break;
        }
        case DW_LLE_start_end:{
            llc->ld_lopc = llc->ld_rawlow;
            llc->ld_highpc = llc->ld_rawhigh;
            break;
        }
        case DW_LLE_start_length:{
            llc->ld_lopc = llc->ld_rawlow;
            llc->ld_highpc = llc->ld_rawlow + llc->ld_rawhigh;
            break;
        }
        case DW_LLE_end_of_list:{
            /* do nothing */
            break;
        }
        default: {
            dwarfstring m;

            dwarfstring_constructor(&m);
            dwarfstring_append_printf_u(&m,
                "DW_DLE_LOCLISTS_ERROR: improper DW_LLE code "
                "of 0x%x is unknown. DWARF5 loclists error",
                llc->ld_lle_value);
            _dwarf_error_string(dbg,error,
                DW_DLE_LOCLISTS_ERROR,
                dwarfstring_string(&m));
            dwarfstring_destructor(&m);
            return DW_DLV_ERROR;
        }
        }
    }
    return DW_DLV_OK;
}